

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

bool xmrig::Json::getBool(Value *obj,char *key,bool defaultValue)

{
  bool bVar1;
  ConstMemberIterator that;
  Pointer pVVar2;
  byte in_DL;
  ConstMemberIterator i;
  bool local_31;
  Ch *in_stack_ffffffffffffffd0;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  in_stack_ffffffffffffffd8;
  bool local_1;
  
  local_1 = (bool)(in_DL & 1);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember(&(in_stack_ffffffffffffffd8.ptr_)->name,in_stack_ffffffffffffffd0);
  that = rapidjson::
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)0x1a5cf4);
  bVar1 = rapidjson::
          GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::operator!=((GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&stack0xffffffffffffffd8,(ConstIterator)that.ptr_);
  local_31 = false;
  if (bVar1) {
    pVVar2 = rapidjson::
             GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator->((GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&stack0xffffffffffffffd8);
    local_31 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::IsBool(&pVVar2->value);
  }
  if (local_31 != false) {
    pVVar2 = rapidjson::
             GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator->((GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&stack0xffffffffffffffd8);
    local_1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetBool(&pVVar2->value);
  }
  return local_1;
}

Assistant:

bool xmrig::Json::getBool(const rapidjson::Value &obj, const char *key, bool defaultValue)
{
    assert(obj.IsObject());

    auto i = obj.FindMember(key);
    if (i != obj.MemberEnd() && i->value.IsBool()) {
        return i->value.GetBool();
    }

    return defaultValue;
}